

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_column_tests.h
# Opt level: O1

void column_test_row_access_constructors<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)0,true,true,true>>>,std::map<unsigned_int,boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)0,true,true,true>>>,boost::intrusive::constant_time_size<false>,boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)0,true,true,true>>::Matrix_row_tag>,boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)0,true,true,true>>>,boost::intrusive::constant_time_size<false>,boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)0,true,true,true>>::Matrix_row_tag>,boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>>>>>>>>
               (vector<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_>_>
                *matrix,map<unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>_>
                        *rows)

{
  _Rb_tree_header *p_Var1;
  Column_support *pCVar2;
  uint uVar3;
  int iVar4;
  _Base_ptr p_Var5;
  List_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>
  *pLVar6;
  _List_node_base *p_Var7;
  _List_node_base *p_Var8;
  undefined8 uVar9;
  Index IVar10;
  Chain_column_option CVar11;
  node_ptr next;
  _Rb_tree_node_base *p_Var12;
  _List_node_base *p_Var13;
  _List_node_base *p_Var14;
  bool bVar15;
  Column_support *__range2;
  undefined4 local_2b4;
  undefined *local_2b0;
  undefined4 *local_2a8;
  undefined **local_2a0;
  undefined **local_298;
  ulong local_290;
  shared_count sStack_288;
  undefined4 **local_280;
  char *local_278;
  char *local_270;
  shared_count sStack_268;
  undefined **local_260;
  undefined1 local_258;
  undefined8 *local_250;
  undefined ***local_248;
  undefined4 **local_240;
  char *local_238;
  undefined **local_230;
  char *local_228;
  shared_count sStack_220;
  char *local_218;
  List_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>
  moveCol;
  List_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>
  col;
  undefined1 *local_170;
  undefined1 *local_168;
  char *local_160;
  char *local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  char *local_140;
  char *local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  char *local_120;
  char *local_118;
  char *local_110;
  char *local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  char *local_f0;
  char *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  char *local_d0;
  char *local_c8;
  undefined1 *local_c0;
  undefined1 *local_b8;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  char *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  char *local_80;
  char *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  build_rows<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)0,true,true,true>>>>
            ();
  get_ordered_rows<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)0,true,true,true>>>>
            ((vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
              *)&moveCol,matrix);
  test_matrix_equality<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)0,true,true,true>>>>
            ((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              *)&col,(vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
                      *)&moveCol);
  std::
  vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
             *)&moveCol);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)&col);
  build_column_values<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)0,true,true,true>>>>
            ();
  get_ordered_column_contents<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)0,true,true,true>>>>
            ((vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
              *)&moveCol,matrix);
  test_matrix_equality<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)0,true,true,true>>>>
            ((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              *)&col,(vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
                      *)&moveCol);
  std::
  vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
             *)&moveCol);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)&col);
  Gudhi::persistence_matrix::
  List_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)0,true,true,true>>>
  ::
  List_column<std::map<unsigned_int,boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)0,true,true,true>>>,boost::intrusive::constant_time_size<false>,boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)0,true,true,true>>::Matrix_row_tag>,boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)0,true,true,true>>>,boost::intrusive::constant_time_size<false>,boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)0,true,true,true>>::Matrix_row_tag>,boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>>>>>>>>
            ((List_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)0,true,true,true>>>
              *)&col,(matrix->
                     super__Vector_base<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start,6,rows,(Column_settings *)0x0);
  uVar9._4_4_ = moveCol._28_4_;
  uVar9._0_4_ = moveCol.super_Chain_column_option.pairedColumn_;
  p_Var12 = (rows->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(rows->_M_t)._M_impl.super__Rb_tree_header;
  IVar10 = col.super_Row_access_option.columnIndex_;
  CVar11 = col.super_Chain_column_option;
  moveCol.column_.
  super__List_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*>_>
  ._M_impl._M_node._M_size =
       col.column_.
       super__List_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*>_>
       ._M_impl._M_node._M_size;
  while (col.column_.
         super__List_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*>_>
         ._M_impl._M_node._M_size =
              moveCol.column_.
              super__List_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*>_>
              ._M_impl._M_node._M_size, (_Rb_tree_header *)p_Var12 != p_Var1) {
    col.super_Row_access_option.columnIndex_ = IVar10;
    col.super_Chain_column_option = CVar11;
    moveCol._24_8_ = uVar9;
    if (p_Var12[1]._M_parent != (_Base_ptr)&p_Var12[1]._M_parent &&
        p_Var12[1]._M_parent != (_Base_ptr)0x0) {
      p_Var5 = p_Var12[1]._M_left;
      uVar3 = *(uint *)&p_Var5->_M_left;
      if ((uVar3 < 6) && ((0x2bU >> (uVar3 & 0x1f) & 1) != 0)) {
        local_120 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
        ;
        local_118 = "";
        local_130 = &boost::unit_test::basic_cstring<char_const>::null;
        local_128 = &boost::unit_test::basic_cstring<char_const>::null;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_120,0x20d);
        local_290 = local_290 & 0xffffffffffffff00;
        local_298 = &PTR__lazy_ostream_001de440;
        sStack_288.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
        local_280 = (undefined4 **)0x1a9184;
        iVar4 = *(int *)&p_Var5[-1]._M_right;
        local_2a8 = (undefined4 *)CONCAT44(local_2a8._4_4_,iVar4);
        local_2b0 = (undefined *)CONCAT44(local_2b0._4_4_,6);
        local_230 = (undefined **)CONCAT71(local_230._1_7_,iVar4 == 6);
        local_228 = (char *)0x0;
        sStack_220.pi_ = (sp_counted_base *)0x0;
        local_278 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
        ;
        local_270 = "";
        local_240 = &local_2a8;
        moveCol.super_Row_access_option.rows_ =
             (Row_container *)((ulong)moveCol.super_Row_access_option.rows_ & 0xffffffffffffff00);
        moveCol.super_Row_access_option._0_8_ = &PTR__lazy_ostream_001de900;
        moveCol.super_Column_dimension_option.dim_ = 0x1e6118;
        moveCol.super_Chain_column_option.pivot_ = 0;
        moveCol._24_8_ = &local_240;
        local_2a0 = &local_2b0;
        local_258 = 0;
        local_260 = &PTR__lazy_ostream_001de940;
        local_250 = &boost::unit_test::lazy_ostream::inst;
        local_248 = &local_2a0;
        boost::test_tools::tt_detail::report_assertion
                  (&local_230,&local_298,&local_278,0x20d,1,2,2,"entry.get_column_index()",&moveCol,
                   "6",&local_260);
        boost::detail::shared_count::~shared_count(&sStack_220);
      }
    }
    p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12);
    IVar10 = col.super_Row_access_option.columnIndex_;
    CVar11 = col.super_Chain_column_option;
    moveCol.column_.
    super__List_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*>_>
    ._M_impl._M_node._M_size =
         col.column_.
         super__List_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*>_>
         ._M_impl._M_node._M_size;
    uVar9 = moveCol._24_8_;
  }
  pCVar2 = &col.column_;
  col.super_Row_access_option.columnIndex_ = 0;
  moveCol.column_.
  super__List_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&moveCol.column_;
  moveCol.super_Row_access_option.columnIndex_ = IVar10;
  col.super_Column_dimension_option.dim_ = -1;
  col.super_Chain_column_option.pivot_ = 0xffffffff;
  col.super_Chain_column_option.pairedColumn_ = 0xffffffff;
  moveCol.super_Chain_column_option.pivot_ = CVar11.pivot_;
  moveCol.super_Chain_column_option.pairedColumn_ = CVar11.pairedColumn_;
  moveCol.column_.
  super__List_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       moveCol.column_.
       super__List_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  if (col.column_.
      super__List_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*>_>
      ._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)pCVar2) {
    (col.column_.
     super__List_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*>_>
     ._M_impl._M_node.super__List_node_base._M_prev)->_M_next =
         moveCol.column_.
         super__List_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*>_>
         ._M_impl._M_node.super__List_node_base._M_next;
    (col.column_.
     super__List_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*>_>
     ._M_impl._M_node.super__List_node_base._M_next)->_M_prev =
         moveCol.column_.
         super__List_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*>_>
         ._M_impl._M_node.super__List_node_base._M_next;
    col.column_.
    super__List_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*>_>
    ._M_impl._M_node._M_size = 0;
    moveCol.column_.
    super__List_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*>_>
    ._M_impl._M_node.super__List_node_base._M_next =
         col.column_.
         super__List_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*>_>
         ._M_impl._M_node.super__List_node_base._M_next;
    moveCol.column_.
    super__List_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*>_>
    ._M_impl._M_node.super__List_node_base._M_prev =
         col.column_.
         super__List_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*>_>
         ._M_impl._M_node.super__List_node_base._M_prev;
    col.column_.
    super__List_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)pCVar2;
    col.column_.
    super__List_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*>_>
    ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)pCVar2;
  }
  moveCol.operators_._0_4_ = col.operators_._0_4_;
  col.operators_._4_4_ = (undefined4)((ulong)col.operators_ >> 0x20);
  moveCol.operators_._4_4_ = col.operators_._4_4_;
  moveCol.entryPool_._0_4_ = col.entryPool_._0_4_;
  col.entryPool_._4_4_ = (undefined4)((ulong)col.entryPool_ >> 0x20);
  moveCol.entryPool_._4_4_ = col.entryPool_._4_4_;
  col.operators_ = (Field_operators *)0x0;
  col.entryPool_ = (Entry_constructor *)0x0;
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  moveCol.super_Row_access_option.rows_ = col.super_Row_access_option.rows_;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x21c);
  local_228 = (char *)((ulong)local_228 & 0xffffffffffffff00);
  local_230 = &PTR__lazy_ostream_001de440;
  sStack_220.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_218 = "";
  local_2a0 = &local_2b0;
  local_2b0 = (undefined *)
              moveCol.column_.
              super__List_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*>_>
              ._M_impl._M_node._M_size;
  local_2a8 = &local_2b4;
  local_2b4 = 4;
  local_270 = (char *)0x0;
  sStack_268.pi_ = (sp_counted_base *)0x0;
  local_240 = (undefined4 **)0x1a9c54;
  local_238 = "";
  local_248 = &local_2a0;
  local_258 = 0;
  local_260 = &PTR__lazy_ostream_001de400;
  local_250 = &boost::unit_test::lazy_ostream::inst;
  local_280 = &local_2a8;
  local_290 = local_290 & 0xffffffffffffff00;
  local_298 = &PTR__lazy_ostream_001de940;
  sStack_288.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_278._0_1_ =
       moveCol.column_.
       super__List_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*>_>
       ._M_impl._M_node._M_size == 4;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_268);
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_58 = "";
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_60,0x21d);
  local_228 = (char *)((ulong)local_228 & 0xffffffffffffff00);
  local_230 = &PTR__lazy_ostream_001de440;
  sStack_220.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_218 = "";
  local_2b0 = (undefined *)
              col.column_.
              super__List_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*>_>
              ._M_impl._M_node._M_size;
  local_278 = (char *)CONCAT71(local_278._1_7_,
                               col.column_.
                               super__List_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*>_>
                               ._M_impl._M_node._M_size == 0);
  local_2b4 = 0;
  local_270 = (char *)0x0;
  sStack_268.pi_ = (sp_counted_base *)0x0;
  local_240 = (undefined4 **)0x1a9c54;
  local_238 = "";
  local_2a0 = &local_2b0;
  local_258 = 0;
  local_260 = &PTR__lazy_ostream_001de400;
  local_250 = &boost::unit_test::lazy_ostream::inst;
  local_248 = &local_2a0;
  local_2a8 = &local_2b4;
  local_290 = local_290 & 0xffffffffffffff00;
  local_298 = &PTR__lazy_ostream_001de940;
  sStack_288.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_280 = &local_2a8;
  boost::test_tools::tt_detail::report_assertion
            (&local_278,&local_230,&local_240,0x21d,1,2,2,"col.size()",&local_260,"0",&local_298);
  boost::detail::shared_count::~shared_count(&sStack_268);
  local_80 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_78 = "";
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  local_88 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_80,0x21e);
  pLVar6 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (pLVar6 == &moveCol) {
    bVar15 = true;
  }
  else {
    if ((pLVar6->column_).
        super__List_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*>_>
        ._M_impl._M_node._M_size ==
        moveCol.column_.
        super__List_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*>_>
        ._M_impl._M_node._M_size) {
      p_Var13 = (_List_node_base *)&moveCol.column_;
      p_Var14 = (_List_node_base *)&pLVar6->column_;
      do {
        p_Var14 = (((_List_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*>_>
                     *)&p_Var14->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
        p_Var13 = (((_List_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*>_>
                     *)&p_Var13->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
        bVar15 = p_Var13 == (_List_node_base *)&moveCol.column_ ||
                 p_Var14 == (_List_node_base *)&pLVar6->column_;
        if (bVar15) goto LAB_0016d58b;
      } while (*(int *)((long)p_Var14[1]._M_next + 0x18) ==
               *(int *)((long)p_Var13[1]._M_next + 0x18));
    }
    bVar15 = false;
  }
LAB_0016d58b:
  local_298 = (undefined **)CONCAT71(local_298._1_7_,bVar15);
  local_290 = 0;
  sStack_288.pi_ = (sp_counted_base *)0x0;
  local_230 = (undefined **)0x1b3d2a;
  local_228 = "";
  local_258 = 0;
  local_260 = &PTR__lazy_ostream_001de388;
  local_250 = &boost::unit_test::lazy_ostream::inst;
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_98 = "";
  local_248 = &local_230;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_288);
  for (p_Var12 = (rows->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var12 != p_Var1;
      p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12)) {
    if (p_Var12[1]._M_parent != (_Base_ptr)&p_Var12[1]._M_parent &&
        p_Var12[1]._M_parent != (_Base_ptr)0x0) {
      p_Var5 = p_Var12[1]._M_left;
      uVar3 = *(uint *)&p_Var5->_M_left;
      if ((uVar3 < 6) && ((0x2bU >> (uVar3 & 0x1f) & 1) != 0)) {
        local_140 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
        ;
        local_138 = "";
        local_150 = &boost::unit_test::basic_cstring<char_const>::null;
        local_148 = &boost::unit_test::basic_cstring<char_const>::null;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_140,0x225,
                   &local_150);
        local_228 = (char *)((ulong)local_228 & 0xffffffffffffff00);
        local_230 = &PTR__lazy_ostream_001de440;
        sStack_220.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
        local_218 = "";
        iVar4 = *(int *)&p_Var5[-1]._M_right;
        local_2b0 = (undefined *)CONCAT44(local_2b0._4_4_,iVar4);
        local_2b4 = 6;
        local_278 = (char *)CONCAT71(local_278._1_7_,iVar4 == 6);
        local_270 = (char *)0x0;
        sStack_268.pi_ = (sp_counted_base *)0x0;
        local_240 = (undefined4 **)0x1a9c54;
        local_238 = "";
        local_2a0 = &local_2b0;
        local_258 = 0;
        local_260 = &PTR__lazy_ostream_001de900;
        local_250 = &boost::unit_test::lazy_ostream::inst;
        local_248 = &local_2a0;
        local_2a8 = &local_2b4;
        local_290 = local_290 & 0xffffffffffffff00;
        local_298 = &PTR__lazy_ostream_001de940;
        sStack_288.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
        local_280 = &local_2a8;
        boost::test_tools::tt_detail::report_assertion
                  (&local_278,&local_230,&local_240,0x225,1,2,2,"entry.get_column_index()",
                   &local_260,"6",&local_298);
        boost::detail::shared_count::~shared_count(&sStack_268);
      }
    }
  }
  Gudhi::persistence_matrix::swap(&col,&moveCol);
  local_b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_a8 = "";
  local_c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_b0,0x234);
  local_228 = (char *)((ulong)local_228 & 0xffffffffffffff00);
  local_230 = &PTR__lazy_ostream_001de440;
  sStack_220.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_218 = "";
  local_2b0 = (undefined *)
              moveCol.column_.
              super__List_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*>_>
              ._M_impl._M_node._M_size;
  local_2b4 = 0;
  local_270 = (char *)0x0;
  sStack_268.pi_ = (sp_counted_base *)0x0;
  local_240 = (undefined4 **)0x1a9c54;
  local_238 = "";
  local_2a0 = &local_2b0;
  local_258 = 0;
  local_260 = &PTR__lazy_ostream_001de400;
  local_250 = &boost::unit_test::lazy_ostream::inst;
  local_248 = &local_2a0;
  local_2a8 = &local_2b4;
  local_290 = local_290 & 0xffffffffffffff00;
  local_298 = &PTR__lazy_ostream_001de940;
  sStack_288.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_280 = &local_2a8;
  local_278._0_1_ =
       moveCol.column_.
       super__List_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*>_>
       ._M_impl._M_node._M_size == 0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_268);
  local_d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_c8 = "";
  local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_d0,0x235);
  local_228 = (char *)((ulong)local_228 & 0xffffffffffffff00);
  local_230 = &PTR__lazy_ostream_001de440;
  sStack_220.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_218 = "";
  local_2b0 = (undefined *)
              col.column_.
              super__List_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*>_>
              ._M_impl._M_node._M_size;
  local_278 = (char *)CONCAT71(local_278._1_7_,
                               col.column_.
                               super__List_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*>_>
                               ._M_impl._M_node._M_size == 4);
  local_2b4 = 4;
  local_270 = (char *)0x0;
  sStack_268.pi_ = (sp_counted_base *)0x0;
  local_240 = (undefined4 **)0x1a9c54;
  local_238 = "";
  local_2a0 = &local_2b0;
  local_258 = 0;
  local_260 = &PTR__lazy_ostream_001de400;
  local_250 = &boost::unit_test::lazy_ostream::inst;
  local_248 = &local_2a0;
  local_2a8 = &local_2b4;
  local_290 = local_290 & 0xffffffffffffff00;
  local_298 = &PTR__lazy_ostream_001de940;
  sStack_288.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_280 = &local_2a8;
  boost::test_tools::tt_detail::report_assertion
            (&local_278,&local_230,&local_240,0x235,1,2,2,"col.size()",&local_260,"4",&local_298);
  boost::detail::shared_count::~shared_count(&sStack_268);
  local_f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_e8 = "";
  local_100 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_f0,0x236);
  pLVar6 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (pLVar6 == &col) {
    bVar15 = true;
  }
  else {
    if ((pLVar6->column_).
        super__List_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*>_>
        ._M_impl._M_node._M_size ==
        col.column_.
        super__List_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*>_>
        ._M_impl._M_node._M_size) {
      p_Var13 = (_List_node_base *)&col.column_;
      p_Var14 = (_List_node_base *)&pLVar6->column_;
      do {
        p_Var14 = (((_List_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*>_>
                     *)&p_Var14->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
        p_Var13 = (((_List_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*>_>
                     *)&p_Var13->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
        bVar15 = p_Var13 == (_List_node_base *)&col.column_ ||
                 p_Var14 == (_List_node_base *)&pLVar6->column_;
        if (bVar15) goto LAB_0016db11;
      } while (*(int *)((long)p_Var14[1]._M_next + 0x18) ==
               *(int *)((long)p_Var13[1]._M_next + 0x18));
    }
    bVar15 = false;
  }
LAB_0016db11:
  local_298 = (undefined **)CONCAT71(local_298._1_7_,bVar15);
  local_290 = 0;
  sStack_288.pi_ = (sp_counted_base *)0x0;
  local_230 = (undefined **)0x1b3d3f;
  local_228 = "";
  local_258 = 0;
  local_260 = &PTR__lazy_ostream_001de388;
  local_250 = &boost::unit_test::lazy_ostream::inst;
  local_110 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_108 = "";
  local_248 = &local_230;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_288);
  for (p_Var12 = (rows->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var12 != p_Var1;
      p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12)) {
    if (p_Var12[1]._M_parent != (_Base_ptr)&p_Var12[1]._M_parent &&
        p_Var12[1]._M_parent != (_Base_ptr)0x0) {
      p_Var5 = p_Var12[1]._M_left;
      uVar3 = *(uint *)&p_Var5->_M_left;
      if ((uVar3 < 6) && ((0x2bU >> (uVar3 & 0x1f) & 1) != 0)) {
        local_160 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
        ;
        local_158 = "";
        local_170 = &boost::unit_test::basic_cstring<char_const>::null;
        local_168 = &boost::unit_test::basic_cstring<char_const>::null;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_160,0x23d,
                   &local_170);
        local_228 = (char *)((ulong)local_228 & 0xffffffffffffff00);
        local_230 = &PTR__lazy_ostream_001de440;
        sStack_220.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
        local_218 = "";
        iVar4 = *(int *)&p_Var5[-1]._M_right;
        local_2b0 = (undefined *)CONCAT44(local_2b0._4_4_,iVar4);
        local_2b4 = 6;
        local_278 = (char *)CONCAT71(local_278._1_7_,iVar4 == 6);
        local_270 = (char *)0x0;
        sStack_268.pi_ = (sp_counted_base *)0x0;
        local_240 = (undefined4 **)0x1a9c54;
        local_238 = "";
        local_2a0 = &local_2b0;
        local_258 = 0;
        local_260 = &PTR__lazy_ostream_001de900;
        local_250 = &boost::unit_test::lazy_ostream::inst;
        local_248 = &local_2a0;
        local_2a8 = &local_2b4;
        local_290 = local_290 & 0xffffffffffffff00;
        local_298 = &PTR__lazy_ostream_001de940;
        sStack_288.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
        local_280 = &local_2a8;
        boost::test_tools::tt_detail::report_assertion
                  (&local_278,&local_230,&local_240,0x23d,1,2,2,"entry.get_column_index()",
                   &local_260,"6",&local_298);
        boost::detail::shared_count::~shared_count(&sStack_268);
      }
    }
  }
  for (p_Var14 = moveCol.column_.
                 super__List_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*>_>
                 ._M_impl._M_node.super__List_node_base._M_next;
      p_Var13 = col.column_.
                super__List_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*>_>
                ._M_impl._M_node.super__List_node_base._M_next,
      p_Var7 = moveCol.column_.
               super__List_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*>_>
               ._M_impl._M_node.super__List_node_base._M_next,
      p_Var14 != (_List_node_base *)&moveCol.column_; p_Var14 = p_Var14->_M_next) {
    p_Var13 = p_Var14[1]._M_next;
    if ((moveCol.super_Row_access_option.rows_ != (Row_container *)0x0) &&
       (p_Var7 = p_Var13->_M_prev, p_Var7 != (_List_node_base *)0x0)) {
      p_Var8 = p_Var13[1]._M_next;
      p_Var8->_M_next = p_Var7;
      p_Var7->_M_prev = p_Var8;
      p_Var13->_M_prev = (_List_node_base *)0x0;
      p_Var13[1]._M_next = (_List_node_base *)0x0;
    }
    if (p_Var13 != (_List_node_base *)0x0) {
      p_Var7 = p_Var13->_M_prev;
      if (p_Var7 != (_List_node_base *)0x0) {
        p_Var8 = p_Var13[1]._M_next;
        p_Var8->_M_next = p_Var7;
        p_Var7->_M_prev = p_Var8;
        p_Var13->_M_prev = (_List_node_base *)0x0;
        p_Var13[1]._M_next = (_List_node_base *)0x0;
      }
      operator_delete(p_Var13,0x20);
    }
  }
  while (col.column_.
         super__List_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*>_>
         ._M_impl._M_node.super__List_node_base._M_next = p_Var13,
        p_Var7 != (_List_node_base *)&moveCol.column_) {
    p_Var14 = p_Var7->_M_next;
    operator_delete(p_Var7,0x18);
    p_Var13 = col.column_.
              super__List_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*>_>
              ._M_impl._M_node.super__List_node_base._M_next;
    p_Var7 = p_Var14;
  }
  for (; p_Var14 = col.column_.
                   super__List_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*>_>
                   ._M_impl._M_node.super__List_node_base._M_next,
      p_Var13 != (_List_node_base *)&col.column_; p_Var13 = p_Var13->_M_next) {
    p_Var14 = p_Var13[1]._M_next;
    if ((col.super_Row_access_option.rows_ != (Row_container *)0x0) &&
       (p_Var7 = p_Var14->_M_prev, p_Var7 != (_List_node_base *)0x0)) {
      p_Var8 = p_Var14[1]._M_next;
      p_Var8->_M_next = p_Var7;
      p_Var7->_M_prev = p_Var8;
      p_Var14->_M_prev = (_List_node_base *)0x0;
      p_Var14[1]._M_next = (_List_node_base *)0x0;
    }
    if (p_Var14 != (_List_node_base *)0x0) {
      p_Var7 = p_Var14->_M_prev;
      if (p_Var7 != (_List_node_base *)0x0) {
        p_Var8 = p_Var14[1]._M_next;
        p_Var8->_M_next = p_Var7;
        p_Var7->_M_prev = p_Var8;
        p_Var14->_M_prev = (_List_node_base *)0x0;
        p_Var14[1]._M_next = (_List_node_base *)0x0;
      }
      operator_delete(p_Var14,0x20);
    }
  }
  while (p_Var14 != (_List_node_base *)&col.column_) {
    p_Var13 = p_Var14->_M_next;
    operator_delete(p_Var14,0x18);
    p_Var14 = p_Var13;
  }
  return;
}

Assistant:

void column_test_row_access_constructors(std::vector<Column>& matrix, Row_container& rows) {
  test_matrix_equality<Column>(build_rows<Column>(), get_ordered_rows(matrix));
  test_matrix_equality<Column>(build_column_values<Column>(), get_ordered_column_contents(matrix));

  Column col(matrix[0], 6, &rows);
  for (auto& r : rows) {
    if constexpr (Column::Master::Option_list::has_removable_rows) {
      if (!r.second.empty()) {
        auto& entry = *r.second.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    } else {
      if (!r.empty()) {
        auto& entry = *r.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    }
  }

  Column moveCol(std::move(col));
  BOOST_CHECK_EQUAL(moveCol.size(), 4);
  BOOST_CHECK_EQUAL(col.size(), 0);
  BOOST_CHECK(matrix[0] == moveCol);
  for (auto& r : rows) {
    if constexpr (Column::Master::Option_list::has_removable_rows) {
      if (!r.second.empty()) {
        auto& entry = *r.second.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    } else {
      if (!r.empty()) {
        auto& entry = *r.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    }
  }

  swap(col, moveCol);
  BOOST_CHECK_EQUAL(moveCol.size(), 0);
  BOOST_CHECK_EQUAL(col.size(), 4);
  BOOST_CHECK(matrix[0] == col);
  for (auto& r : rows) {
    if constexpr (Column::Master::Option_list::has_removable_rows) {
      if (!r.second.empty()) {
        auto& entry = *r.second.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    } else {
      if (!r.empty()) {
        auto& entry = *r.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    }
  }
}